

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O1

int lgx_co_has_task(lgx_vm_t *vm)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((vm->co_running == (lgx_co_t *)0x0) && ((vm->co_ready).next == &vm->co_ready)) {
    uVar1 = (uint)((vm->co_suspend).next != &vm->co_suspend);
  }
  return uVar1;
}

Assistant:

int lgx_co_has_task(lgx_vm_t *vm) {
    if (vm->co_running) {
        return 1;
    }

    if (!lgx_list_empty(&vm->co_ready)) {
        return 1;
    }

    if (!lgx_list_empty(&vm->co_suspend)) {
        return 1;
    }

    return 0;
}